

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConst<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclConst<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *pTVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  string shader_source;
  long *local_48 [2];
  long local_38 [2];
  
  puVar3 = (undefined1 *)local_48;
  puVar4 = (undefined1 *)local_48;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,
             "const float[2][2] x = float[2][2](float[2](1.0, 2.0), float[2](3.0, 4.0));\n\n","");
  std::__cxx11::string::_M_append((char *)local_48,shader_start_abi_cxx11_);
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
  case COMPUTE_SHADER_TYPE:
  case TESSELATION_EVALUATION_SHADER_TYPE:
    break;
  case VERTEX_SHADER_TYPE:
    std::__cxx11::string::append((char *)local_48);
    break;
  case GEOMETRY_SHADER_TYPE:
    puVar1 = &emit_quad_abi_cxx11_;
    goto LAB_00b319c8;
  case TESSELATION_CONTROL_SHADER_TYPE:
    puVar1 = &set_tesseation_abi_cxx11_;
LAB_00b319c8:
    std::__cxx11::string::_M_append((char *)local_48,*puVar1);
    break;
  default:
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x85f);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_append((char *)local_48,shader_end_abi_cxx11_);
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
    break;
  case VERTEX_SHADER_TYPE:
    puVar3 = default_fragment_shader_source_abi_cxx11_;
    goto LAB_00b31a28;
  case COMPUTE_SHADER_TYPE:
    puVar4 = empty_string_abi_cxx11_;
    puVar3 = empty_string_abi_cxx11_;
    goto LAB_00b31a28;
  case GEOMETRY_SHADER_TYPE:
  case TESSELATION_CONTROL_SHADER_TYPE:
  case TESSELATION_EVALUATION_SHADER_TYPE:
    puVar3 = default_fragment_shader_source_abi_cxx11_;
    break;
  default:
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x862);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  puVar4 = default_vertex_shader_source_abi_cxx11_;
LAB_00b31a28:
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[9])(this,puVar4,puVar3,1,0);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclConst<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_source = "const float[2][2] x = float[2][2](float[2](1.0, 2.0), float[2](3.0, 4.0));\n\n";
	shader_source += shader_start;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
}